

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_check_include_missing_recursive(lys_module *main_module,lys_submodule *sub)

{
  ly_ctx *ctx_00;
  lys_include *plVar1;
  lys_include *plVar2;
  int iVar3;
  ly_ctx *ctx;
  int tmp;
  int ret;
  void *reallocated;
  uint8_t j;
  uint8_t i;
  lys_submodule *sub_local;
  lys_module *main_module_local;
  
  ctx._4_4_ = 0;
  ctx_00 = main_module->ctx;
  reallocated._7_1_ = 0;
  do {
    if (sub->inc_size <= reallocated._7_1_) {
      return ctx._4_4_;
    }
    reallocated._6_1_ = 0;
    while ((reallocated._6_1_ < main_module->inc_size &&
           (main_module->inc[reallocated._6_1_].submodule != sub->inc[reallocated._7_1_].submodule))
          ) {
      reallocated._6_1_ = reallocated._6_1_ + 1;
    }
    if (reallocated._6_1_ == main_module->inc_size) {
      if (((byte)(*(ushort *)&main_module->field_0x40 >> 1) & 7) < 2) {
        ly_log(ctx_00,LY_LLWRN,LY_SUCCESS,
               "The main module \"%s\" misses include of the \"%s\" submodule used in another submodule \"%s\"."
               ,main_module->name,(sub->inc[reallocated._7_1_].submodule)->name,sub->name);
        ly_log(ctx_00,LY_LLWRN,LY_SUCCESS,
               "To avoid further issues, adding submodule \"%s\" into the main module \"%s\".",
               (sub->inc[reallocated._7_1_].submodule)->name,main_module->name);
      }
      else {
        ly_vlog(ctx_00,LYE_MISSSTMT,LY_VLOG_NONE,(void *)0x0,"include");
        ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                "The main module \"%s\" misses include of the \"%s\" submodule used in another submodule \"%s\"."
                ,main_module->name,(sub->inc[reallocated._7_1_].submodule)->name,sub->name);
        ctx._4_4_ = 1;
      }
      main_module->inc_size = main_module->inc_size + '\x01';
      plVar2 = (lys_include *)realloc(main_module->inc,(ulong)main_module->inc_size * 0x30);
      if (plVar2 == (lys_include *)0x0) {
        ly_log(ctx_00,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyp_check_include_missing_recursive");
        return 1;
      }
      main_module->inc = plVar2;
      memset(main_module->inc + (int)(main_module->inc_size - 1),0,0x30);
      plVar2 = main_module->inc;
      iVar3 = main_module->inc_size - 1;
      plVar1 = sub->inc;
      *(undefined8 *)plVar2[iVar3].rev = *(undefined8 *)plVar1[reallocated._7_1_].rev;
      *(undefined2 *)(plVar2[iVar3].rev + 8) = *(undefined2 *)(plVar1[reallocated._7_1_].rev + 8);
      main_module->inc[(int)(main_module->inc_size - 1)].submodule =
           sub->inc[reallocated._7_1_].submodule;
    }
    iVar3 = lyp_check_include_missing_recursive(main_module,sub->inc[reallocated._7_1_].submodule);
    if ((ctx._4_4_ == 0) && (iVar3 != 0)) {
      ctx._4_4_ = 1;
    }
    reallocated._7_1_ = reallocated._7_1_ + 1;
  } while( true );
}

Assistant:

static int
lyp_check_include_missing_recursive(struct lys_module *main_module, struct lys_submodule *sub)
{
    uint8_t i, j;
    void *reallocated;
    int ret = 0, tmp;
    struct ly_ctx *ctx = main_module->ctx;

    for (i = 0; i < sub->inc_size; i++) {
        /* check that the include is also present in the main module */
        for (j = 0; j < main_module->inc_size; j++) {
            if (main_module->inc[j].submodule == sub->inc[i].submodule) {
                break;
            }
        }

        if (j == main_module->inc_size) {
            /* match not found */
            if (main_module->version >= LYS_VERSION_1_1) {
                LOGVAL(ctx, LYE_MISSSTMT, LY_VLOG_NONE, NULL, "include");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL,
                       "The main module \"%s\" misses include of the \"%s\" submodule used in another submodule \"%s\".",
                       main_module->name, sub->inc[i].submodule->name, sub->name);
                /* now we should return error, but due to the issues with freeing the module, we actually have
                 * to go through the all includes and, as in case of 1.0, add them into the main module and fail
                 * at the end when all the includes are in the main module and we can free them */
                ret = 1;
            } else {
                /* not strictly an error in YANG 1.0 */
                LOGWRN(ctx, "The main module \"%s\" misses include of the \"%s\" submodule used in another submodule \"%s\".",
                       main_module->name, sub->inc[i].submodule->name, sub->name);
                LOGWRN(ctx, "To avoid further issues, adding submodule \"%s\" into the main module \"%s\".",
                       sub->inc[i].submodule->name, main_module->name);
                /* but since it is a good practise and because we expect all the includes in the main module
                 * when searching it and also when freeing the module, put it into it */
            }
            main_module->inc_size++;
            reallocated = realloc(main_module->inc, main_module->inc_size * sizeof *main_module->inc);
            LY_CHECK_ERR_RETURN(!reallocated, LOGMEM(ctx), 1);
            main_module->inc = reallocated;
            memset(&main_module->inc[main_module->inc_size - 1], 0, sizeof *main_module->inc);
            /* to avoid unexpected consequences, copy just a link to the submodule and the revision,
             * all other substatements of the include are ignored */
            memcpy(&main_module->inc[main_module->inc_size - 1].rev, sub->inc[i].rev, LY_REV_SIZE - 1);
            main_module->inc[main_module->inc_size - 1].submodule = sub->inc[i].submodule;
        }

        /* recursion */
        tmp = lyp_check_include_missing_recursive(main_module, sub->inc[i].submodule);
        if (!ret && tmp) {
            ret = 1;
        }
    }

    return ret;
}